

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scopes.cpp
# Opt level: O3

void __thiscall
example::example(example *this,shared_ptr<per_request> *sp1,shared_ptr<per_request> *sp2,shared *s1,
                shared *s2)

{
  if ((sp1->super___shared_ptr<per_request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (sp2->super___shared_ptr<per_request,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
    __assert_fail("sp1 != sp2",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/scopes.cpp"
                  ,0x26,
                  "example::example(std::shared_ptr<per_request>, std::shared_ptr<per_request>, const shared &, shared &)"
                 );
  }
  if (s1 == s2) {
    return;
  }
  __assert_fail("&s1 == &s2",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/scopes.cpp"
                ,0x27,
                "example::example(std::shared_ptr<per_request>, std::shared_ptr<per_request>, const shared &, shared &)"
               );
}

Assistant:

example(std::shared_ptr<per_request> sp1 /*unique*/
        , std::shared_ptr<per_request> sp2 /*unique*/
        , const shared& s1 /*singleton*/
        , shared& s2 /*singleton*/) {
    assert(sp1 != sp2);
    assert(&s1 == &s2);
  }